

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chest.cpp
# Opt level: O0

void Handlers::Chest_Open(Character *character,PacketReader *reader)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  TileSpec TVar4;
  vector<std::shared_ptr<Map_Chest>,_std::allocator<std::shared_ptr<Map_Chest>_>_> *this;
  reference psVar5;
  element_type *peVar6;
  size_type sVar7;
  pointer pMVar8;
  _Self local_98;
  _Self local_90;
  const_iterator item;
  shared_ptr<Map_Chest> chest;
  iterator __end3;
  iterator __begin3;
  vector<std::shared_ptr<Map_Chest>,_std::allocator<std::shared_ptr<Map_Chest>_>_> *__range3;
  undefined1 local_50 [8];
  PacketBuilder reply;
  int y;
  int x;
  PacketReader *reader_local;
  Character *character_local;
  
  bVar1 = PacketReader::GetChar(reader);
  reply.add_size._4_4_ = (uint)bVar1;
  bVar1 = PacketReader::GetChar(reader);
  reply.add_size._0_4_ = (uint)bVar1;
  iVar3 = util::path_length((uint)character->x,(uint)character->y,reply.add_size._4_4_,
                            (uint)reply.add_size);
  if ((iVar3 < 2) &&
     (TVar4 = Map::GetSpec(character->map,(uchar)reply.add_size._4_4_,(uchar)(uint)reply.add_size),
     TVar4 == Chest)) {
    PacketBuilder::PacketBuilder((PacketBuilder *)local_50,PACKET_CHEST,PACKET_OPEN,2);
    PacketBuilder::AddChar((PacketBuilder *)local_50,reply.add_size._4_4_);
    PacketBuilder::AddChar((PacketBuilder *)local_50,(uint)reply.add_size);
    this = &character->map->chests;
    __end3 = std::vector<std::shared_ptr<Map_Chest>,_std::allocator<std::shared_ptr<Map_Chest>_>_>::
             begin(this);
    chest.super___shared_ptr<Map_Chest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::vector<std::shared_ptr<Map_Chest>,_std::allocator<std::shared_ptr<Map_Chest>_>_>::end
                   (this);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<std::shared_ptr<Map_Chest>_*,_std::vector<std::shared_ptr<Map_Chest>,_std::allocator<std::shared_ptr<Map_Chest>_>_>_>
                                       *)&chest.
                                          super___shared_ptr<Map_Chest,_(__gnu_cxx::_Lock_policy)2>.
                                          _M_refcount), bVar2) {
      psVar5 = __gnu_cxx::
               __normal_iterator<std::shared_ptr<Map_Chest>_*,_std::vector<std::shared_ptr<Map_Chest>,_std::allocator<std::shared_ptr<Map_Chest>_>_>_>
               ::operator*(&__end3);
      std::shared_ptr<Map_Chest>::shared_ptr((shared_ptr<Map_Chest> *)&item,psVar5);
      peVar6 = std::__shared_ptr_access<Map_Chest,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Map_Chest,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&item);
      if ((peVar6->x == reply.add_size._4_4_) &&
         (peVar6 = std::__shared_ptr_access<Map_Chest,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<Map_Chest,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&item), peVar6->y == (uint)reply.add_size)) {
        peVar6 = std::__shared_ptr_access<Map_Chest,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Map_Chest,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&item);
        sVar7 = std::__cxx11::list<Map_Chest_Item,_std::allocator<Map_Chest_Item>_>::size
                          (&peVar6->items);
        PacketBuilder::ReserveMore((PacketBuilder *)local_50,sVar7 * 5);
        peVar6 = std::__shared_ptr_access<Map_Chest,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Map_Chest,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&item);
        local_90._M_node =
             (_List_node_base *)
             std::cbegin<std::__cxx11::list<Map_Chest_Item,std::allocator<Map_Chest_Item>>>
                       (&peVar6->items);
        while( true ) {
          peVar6 = std::__shared_ptr_access<Map_Chest,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<Map_Chest,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&item);
          local_98._M_node =
               (_List_node_base *)
               std::cend<std::__cxx11::list<Map_Chest_Item,std::allocator<Map_Chest_Item>>>
                         (&peVar6->items);
          bVar2 = std::operator!=(&local_90,&local_98);
          if (!bVar2) break;
          pMVar8 = std::_List_const_iterator<Map_Chest_Item>::operator->(&local_90);
          if (pMVar8->id != 0) {
            pMVar8 = std::_List_const_iterator<Map_Chest_Item>::operator->(&local_90);
            PacketBuilder::AddShort((PacketBuilder *)local_50,(int)pMVar8->id);
            pMVar8 = std::_List_const_iterator<Map_Chest_Item>::operator->(&local_90);
            PacketBuilder::AddThree((PacketBuilder *)local_50,pMVar8->amount);
          }
          std::_List_const_iterator<Map_Chest_Item>::operator++(&local_90);
        }
        Character::Send(character,(PacketBuilder *)local_50);
        bVar2 = true;
      }
      else {
        bVar2 = false;
      }
      std::shared_ptr<Map_Chest>::~shared_ptr((shared_ptr<Map_Chest> *)&item);
      if (bVar2) break;
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<Map_Chest>_*,_std::vector<std::shared_ptr<Map_Chest>,_std::allocator<std::shared_ptr<Map_Chest>_>_>_>
      ::operator++(&__end3);
    }
    PacketBuilder::~PacketBuilder((PacketBuilder *)local_50);
  }
  return;
}

Assistant:

void Chest_Open(Character *character, PacketReader &reader)
{
	int x = reader.GetChar();
	int y = reader.GetChar();

	if (util::path_length(character->x, character->y, x, y) <= 1)
	{
		if (character->map->GetSpec(x, y) == Map_Tile::Chest)
		{
			PacketBuilder reply(PACKET_CHEST, PACKET_OPEN, 2);
			reply.AddChar(x);
			reply.AddChar(y);

			UTIL_FOREACH(character->map->chests, chest)
			{
				if (chest->x == x && chest->y == y)
				{
					reply.ReserveMore(chest->items.size() * 5);

					UTIL_CIFOREACH(chest->items, item)
					{
						if (item->id != 0)
						{
							reply.AddShort(item->id);
							reply.AddThree(item->amount);
						}
					}

					character->Send(reply);
					break;
				}
			}
		}
	}
}